

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::createProgram(FunctionalTest *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  int *piVar7;
  undefined4 *puVar8;
  bool bVar9;
  int *piVar10;
  GLchar **ppGVar11;
  GLint status;
  Shader shader [2];
  int local_5c;
  undefined8 local_58;
  undefined4 uStack_50;
  int iStack_4c;
  GLchar *local_48;
  undefined8 uStack_40;
  long lVar6;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  piVar10 = &iStack_4c;
  local_48 = 
  "#version 130\n\nuniform float color;\nuniform int   shall_pass;\n\nout vec4 pixel;\n\nvoid main()\n{\n    if(0 == shall_pass)\n    {\n        discard;\n    }\n\n    pixel = vec4(color);\n}\n"
  ;
  uStack_40 = 0x8b30;
  local_58._0_4_ = 0x1a44350;
  local_58._4_4_ = 0;
  uStack_50 = 0x8b31;
  iStack_4c = 0;
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  this->m_po_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                  ,0x17a);
  ppGVar11 = (GLchar **)&local_58;
  bVar1 = true;
  do {
    bVar9 = bVar1;
    if (*ppGVar11 != (GLchar *)0x0) {
      uVar5 = (**(code **)(lVar6 + 0x3f0))(*(undefined4 *)(ppGVar11 + 1));
      *(undefined4 *)((long)ppGVar11 + 0xc) = uVar5;
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x184);
      (**(code **)(lVar6 + 0x10))(this->m_po_id,*(undefined4 *)((long)ppGVar11 + 0xc));
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x188);
      (**(code **)(lVar6 + 0x12b8))(*(undefined4 *)((long)ppGVar11 + 0xc),1,ppGVar11,0);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x18c);
      (**(code **)(lVar6 + 0x248))(*(undefined4 *)((long)ppGVar11 + 0xc));
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,400);
      local_5c = 0;
      (**(code **)(lVar6 + 0xa70))(*(undefined4 *)((long)ppGVar11 + 0xc),0x8b81,&local_5c);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x195);
      if (local_5c == 0) {
        puVar8 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar8 = 0;
        __cxa_throw(puVar8,&int::typeinfo,0);
      }
    }
    ppGVar11 = &local_48;
    bVar1 = false;
  } while (bVar9);
  (**(code **)(lVar6 + 0xce8))(this->m_po_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                  ,0x1a1);
  local_5c = 0;
  (**(code **)(lVar6 + 0x9d8))(this->m_po_id,0x8b82);
  if (local_5c == 1) {
    piVar7 = piVar10;
    bVar1 = true;
    do {
      bVar9 = bVar1;
      if (*piVar7 != 0) {
        (**(code **)(lVar6 + 0x4e0))(this->m_po_id);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glDetachShader call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                        ,0x1af);
      }
      piVar7 = (int *)((long)&uStack_40 + 4);
      bVar1 = false;
    } while (bVar9);
    bVar1 = true;
    do {
      bVar9 = bVar1;
      if (*piVar10 != 0) {
        (**(code **)(lVar6 + 0x470))();
        *piVar10 = 0;
      }
      piVar10 = (int *)((long)&uStack_40 + 4);
      bVar1 = false;
    } while (bVar9);
    if (this->m_po_id != 0) {
      (**(code **)(lVar6 + 0x1680))();
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glUseProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x1d0);
    }
    return;
  }
  puVar8 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar8 = 0;
  __cxa_throw(puVar8,&int::typeinfo,0);
}

Assistant:

void gl4cts::ConditionalRenderInverted::FunctionalTest::createProgram()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { s_vertex_shader, GL_VERTEX_SHADER, 0 }, { s_fragment_shader, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		m_po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(m_po_id, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					throw 0;
				}
			}
		}

		/* Link. */
		gl.linkProgram(m_po_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(m_po_id, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			throw 0;
		}
	}
	catch (...)
	{
		if (m_po_id)
		{
			gl.deleteProgram(m_po_id);

			m_po_id = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (m_po_id)
	{
		gl.useProgram(m_po_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");
	}
}